

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O2

t_int * tabplay_tilde_perform(t_int *w)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined4 *puVar9;
  int iVar10;
  
  lVar4 = w[1];
  puVar9 = (undefined4 *)w[2];
  iVar1 = *(int *)(lVar4 + 0x38);
  iVar3 = *(int *)(lVar4 + 0x40);
  if (*(int *)(lVar4 + 0x3c) < *(int *)(lVar4 + 0x40)) {
    iVar3 = *(int *)(lVar4 + 0x3c);
  }
  lVar2 = *(long *)(lVar4 + 0x48);
  iVar10 = (int)w[3];
  if (lVar2 == 0 || iVar3 <= iVar1) {
    for (lVar4 = 0; iVar10 != (int)lVar4; lVar4 = lVar4 + 1) {
      puVar9[lVar4] = 0;
    }
  }
  else {
    iVar7 = iVar3 - iVar1;
    iVar5 = iVar10;
    if (iVar7 < iVar10) {
      iVar5 = iVar7;
    }
    iVar6 = iVar10;
    if (iVar7 < iVar10) {
      iVar6 = iVar7;
    }
    for (lVar8 = 0; iVar6 != (int)lVar8; lVar8 = lVar8 + 1) {
      *puVar9 = *(undefined4 *)(lVar2 + (long)iVar1 * 8 + lVar8 * 8);
      puVar9 = puVar9 + 1;
    }
    if (iVar5 + iVar1 < iVar3) {
      *(int *)(lVar4 + 0x38) = iVar5 + iVar1;
    }
    else {
      clock_delay(*(_clock **)(lVar4 + 0x58),0.0);
      *(undefined4 *)(lVar4 + 0x38) = 0x7fffffff;
      for (lVar4 = 0; iVar10 - iVar5 != (int)lVar4; lVar4 = lVar4 + 1) {
        puVar9[lVar4] = 0;
      }
    }
  }
  return w + 4;
}

Assistant:

static t_int *tabplay_tilde_perform(t_int *w)
{
    t_tabplay_tilde *x = (t_tabplay_tilde *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    t_word *wp;
    int n = (int)(w[3]), phase = x->x_phase,
        endphase = (x->x_nsampsintab < x->x_limit ?
            x->x_nsampsintab : x->x_limit), nxfer, n3;
    if (!x->x_vec || phase >= endphase)
        goto zero;

    nxfer = endphase - phase;
    wp = x->x_vec + phase;
    if (nxfer > n)
        nxfer = n;
    n3 = n - nxfer;
    phase += nxfer;
    while (nxfer--)
        *out++ = (wp++)->w_float;
    if (phase >= endphase)
    {
        clock_delay(x->x_clock, 0);
        x->x_phase = 0x7fffffff;
        while (n3--)
            *out++ = 0;
    }
    else x->x_phase = phase;

    return (w+4);
zero:
    while (n--) *out++ = 0;
    return (w+4);
}